

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_particleSpectra.cpp
# Opt level: O0

void __thiscall
singleParticleSpectra::calculate_two_particle_correlation_deltaeta_chdep
          (singleParticleSpectra *this,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Qn_p_rap_real,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Qn_p_rap_imag,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Qn_m_rap_real,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Qn_m_rap_imag,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *C_n2_ss_eta12,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *C_n2_ss_eta12_err,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *C_n2_os_eta12,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *C_n2_os_eta12_err)

{
  singleParticleSpectra *this_00;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *event_Q2_diff_imag;
  reference pvVar1;
  reference pvVar2;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *event_Q1_diff_real;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_RDI;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_R9;
  double dVar3;
  double dVar4;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_stack_00000008;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_stack_00000010;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_stack_00000018;
  double temp_os;
  double temp_ss;
  int j;
  int i;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  temp_Cn2_err;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  temp_Cn2_os_2;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  temp_Cn2_os_1;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  temp_Cn2_ss_2;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  temp_Cn2_ss_1;
  allocator_type *in_stack_fffffffffffffd78;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffd80;
  size_type in_stack_fffffffffffffd88;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffd90;
  int flag;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *event_Q2_diff_real;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *event_Q1_diff_imag;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *corr;
  int local_184;
  int local_180;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_118;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_f9;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_d8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_ba;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_98;
  undefined1 local_7d [53];
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_48;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_30;
  
  local_7d._21_8_ = 0;
  local_30 = in_R9;
  std::allocator<double>::allocator((allocator<double> *)0x16ee9e);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
             (value_type *)in_stack_fffffffffffffd80,(allocator_type *)in_stack_fffffffffffffd78);
  corr = (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *)local_7d;
  std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x16eeda);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,
           in_stack_fffffffffffffd78);
  std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x16ef0e);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffd80);
  std::allocator<double>::~allocator((allocator<double> *)0x16ef28);
  event_Q1_diff_real =
       (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        *)(long)*(int *)&in_RDI[0x13].
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
  this_00 = (singleParticleSpectra *)
            (long)*(int *)((long)&in_RDI[0x18].
                                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
  local_ba.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._2_8_ = 0;
  std::allocator<double>::allocator((allocator<double> *)0x16ef6f);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
             (value_type *)in_stack_fffffffffffffd80,(allocator_type *)in_stack_fffffffffffffd78);
  event_Q1_diff_imag = &local_ba;
  std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x16efab);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,
           in_stack_fffffffffffffd78);
  std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x16efdf);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffd80);
  std::allocator<double>::~allocator((allocator<double> *)0x16eff9);
  flag = *(int *)&in_RDI[0x13].
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 0x1f;
  event_Q2_diff_imag =
       (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        *)(long)*(int *)((long)&in_RDI[0x18].
                                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
  local_f9.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._1_8_ = 0;
  event_Q2_diff_real = &local_f9;
  std::allocator<double>::allocator((allocator<double> *)0x16f040);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
             (value_type *)in_stack_fffffffffffffd80,(allocator_type *)in_stack_fffffffffffffd78);
  std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x16f07c);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,
           in_stack_fffffffffffffd78);
  std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x16f0b0);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffd80);
  std::allocator<double>::~allocator((allocator<double> *)0x16f0ca);
  std::allocator<double>::allocator((allocator<double> *)0x16f111);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
             (value_type *)in_stack_fffffffffffffd80,(allocator_type *)in_stack_fffffffffffffd78);
  std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x16f14a);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,
           in_stack_fffffffffffffd78);
  std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x16f17b);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffd80);
  std::allocator<double>::~allocator((allocator<double> *)0x16f195);
  std::allocator<double>::allocator((allocator<double> *)0x16f1d3);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
             (value_type *)in_stack_fffffffffffffd80,(allocator_type *)in_stack_fffffffffffffd78);
  std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x16f206);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,
           in_stack_fffffffffffffd78);
  std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x16f234);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffd80);
  std::allocator<double>::~allocator((allocator<double> *)0x16f24e);
  calculate_two_particle_correlation_deltaeta_chdep_base
            (this_00,event_Q1_diff_real,event_Q1_diff_imag,event_Q2_diff_real,event_Q2_diff_imag,
             flag,corr,in_RDI);
  calculate_two_particle_correlation_deltaeta_chdep_base
            (this_00,event_Q1_diff_real,event_Q1_diff_imag,event_Q2_diff_real,event_Q2_diff_imag,
             flag,corr,in_RDI);
  calculate_two_particle_correlation_deltaeta_chdep_base
            (this_00,event_Q1_diff_real,event_Q1_diff_imag,event_Q2_diff_real,event_Q2_diff_imag,
             flag,corr,in_RDI);
  calculate_two_particle_correlation_deltaeta_chdep_base
            (this_00,event_Q1_diff_real,event_Q1_diff_imag,event_Q2_diff_real,event_Q2_diff_imag,
             flag,corr,in_RDI);
  for (local_180 = 0;
      local_180 <
      *(int *)&in_RDI[0x13].
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start; local_180 = local_180 + 1) {
    for (local_184 = 0;
        local_184 <
        *(int *)((long)&in_RDI[0x18].
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
        local_184 = local_184 + 1) {
      pvVar1 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&local_48,(long)local_180);
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](pvVar1,(long)local_184);
      in_stack_fffffffffffffd80 = (vector<double,_std::allocator<double>_> *)*pvVar2;
      pvVar1 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&local_98,(long)local_180);
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](pvVar1,(long)local_184);
      dVar3 = (double)in_stack_fffffffffffffd80 + *pvVar2;
      dVar4 = dVar3;
      pvVar1 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](local_30,(long)local_180);
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](pvVar1,(long)local_184);
      *pvVar2 = dVar4 + *pvVar2;
      dVar4 = dVar3;
      pvVar1 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](in_stack_00000008,(long)local_180);
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](pvVar1,(long)local_184);
      *pvVar2 = dVar4 * dVar3 + *pvVar2;
      pvVar1 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&local_d8,(long)local_180);
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](pvVar1,(long)local_184);
      dVar4 = *pvVar2;
      pvVar1 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&local_118,(long)local_180);
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](pvVar1,(long)local_184);
      dVar4 = dVar4 + *pvVar2;
      pvVar1 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](in_stack_00000010,(long)local_180);
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](pvVar1,(long)local_184);
      *pvVar2 = dVar4 + *pvVar2;
      pvVar1 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](in_stack_00000018,(long)local_180);
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](pvVar1,(long)local_184);
      *pvVar2 = dVar4 * dVar4 + *pvVar2;
    }
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)in_stack_fffffffffffffd80);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)in_stack_fffffffffffffd80);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)in_stack_fffffffffffffd80);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)in_stack_fffffffffffffd80);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)in_stack_fffffffffffffd80);
  return;
}

Assistant:

void singleParticleSpectra::calculate_two_particle_correlation_deltaeta_chdep(
    vector<vector<double>> &event_Qn_p_rap_real,
    vector<vector<double>> &event_Qn_p_rap_imag,
    vector<vector<double>> &event_Qn_m_rap_real,
    vector<vector<double>> &event_Qn_m_rap_imag,
    vector<vector<double>> &C_n2_ss_eta12,
    vector<vector<double>> &C_n2_ss_eta12_err,
    vector<vector<double>> &C_n2_os_eta12,
    vector<vector<double>> &C_n2_os_eta12_err) {
    vector<vector<double>> temp_Cn2_ss_1(order_max, vector<double>(N_rap, 0.));
    vector<vector<double>> temp_Cn2_ss_2(order_max, vector<double>(N_rap, 0.));
    vector<vector<double>> temp_Cn2_os_1(order_max, vector<double>(N_rap, 0.));
    vector<vector<double>> temp_Cn2_os_2(order_max, vector<double>(N_rap, 0.));
    vector<vector<double>> temp_Cn2_err(order_max, vector<double>(N_rap, 0.));

    calculate_two_particle_correlation_deltaeta_chdep_base(
        event_Qn_p_rap_real, event_Qn_p_rap_imag, event_Qn_p_rap_real,
        event_Qn_p_rap_imag, 0, temp_Cn2_ss_1, temp_Cn2_err);
    calculate_two_particle_correlation_deltaeta_chdep_base(
        event_Qn_m_rap_real, event_Qn_m_rap_imag, event_Qn_m_rap_real,
        event_Qn_m_rap_imag, 0, temp_Cn2_ss_2, temp_Cn2_err);
    calculate_two_particle_correlation_deltaeta_chdep_base(
        event_Qn_p_rap_real, event_Qn_p_rap_imag, event_Qn_m_rap_real,
        event_Qn_m_rap_imag, 1, temp_Cn2_os_1, temp_Cn2_err);
    calculate_two_particle_correlation_deltaeta_chdep_base(
        event_Qn_m_rap_real, event_Qn_m_rap_imag, event_Qn_p_rap_real,
        event_Qn_p_rap_imag, 1, temp_Cn2_os_2, temp_Cn2_err);

    for (int i = 0; i < order_max; i++) {
        for (int j = 0; j < N_rap; j++) {
            double temp_ss = temp_Cn2_ss_1[i][j] + temp_Cn2_ss_2[i][j];
            C_n2_ss_eta12[i][j] += temp_ss;
            C_n2_ss_eta12_err[i][j] += temp_ss * temp_ss;
            double temp_os = temp_Cn2_os_1[i][j] + temp_Cn2_os_2[i][j];
            C_n2_os_eta12[i][j] += temp_os;
            C_n2_os_eta12_err[i][j] += temp_os * temp_os;
        }
    }
}